

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O0

String * __thiscall
cplus::utils::Stack<int>::toString(String *__return_storage_ptr__,Stack<int> *this)

{
  cplus_queue_size_t cVar1;
  undefined1 local_40 [8];
  StringBuilder stringBuilder;
  Stack<int> *this_local;
  
  stringBuilder._32_8_ = this;
  StringBuilder::StringBuilder((StringBuilder *)local_40);
  StringBuilder::append((StringBuilder *)local_40,"cplus::utils::Stack(");
  StringBuilder::append((StringBuilder *)local_40,"stack size:");
  cVar1 = size(this);
  StringBuilder::append((StringBuilder *)local_40,(ulong)cVar1);
  StringBuilder::append((StringBuilder *)local_40,")");
  StringBuilder::toString(__return_storage_ptr__,(StringBuilder *)local_40);
  StringBuilder::~StringBuilder((StringBuilder *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline ::cplus::lang::String toString() const override {
				StringBuilder stringBuilder;
				stringBuilder.append("cplus::utils::Stack(");
				stringBuilder.append("stack size:");
				stringBuilder.append((long) size());
				stringBuilder.append(")");
				return stringBuilder.toString();
			}